

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void Load8x4_SSE2(uint8_t *b,int stride,__m128i *p,__m128i *q)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [14];
  unkbyte10 Var7;
  undefined1 auVar8 [14];
  unkbyte10 Var9;
  undefined1 auVar10 [12];
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined4 uVar25;
  undefined1 auVar27 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar26 [12];
  undefined1 auVar36 [16];
  
  lVar11 = (long)stride;
  uVar25 = *(undefined4 *)(b + lVar11 * 2);
  uVar1 = *(undefined4 *)(b + lVar11 * 6);
  auVar13._0_8_ = CONCAT44(uVar1,uVar25);
  uVar2 = *(undefined4 *)(b + lVar11 * 4);
  uVar3 = *(undefined4 *)b;
  auVar29._0_8_ = CONCAT44(uVar2,uVar3);
  uVar4 = *(undefined4 *)(b + lVar11 * 7);
  uVar5 = *(undefined4 *)(b + lVar11 * 3);
  auVar19._8_6_ = 0;
  auVar19._0_8_ = auVar13._0_8_;
  auVar19[0xe] = (char)((uint)uVar1 >> 0x18);
  auVar19[0xf] = (char)((uint)uVar4 >> 0x18);
  auVar18._14_2_ = auVar19._14_2_;
  auVar18._8_5_ = 0;
  auVar18._0_8_ = auVar13._0_8_;
  auVar18[0xd] = (char)((uint)uVar4 >> 0x10);
  auVar17._13_3_ = auVar18._13_3_;
  auVar17._8_4_ = 0;
  auVar17._0_8_ = auVar13._0_8_;
  auVar17[0xc] = (char)((uint)uVar1 >> 0x10);
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._8_3_ = 0;
  auVar16._0_8_ = auVar13._0_8_;
  auVar16[0xb] = (char)((uint)uVar4 >> 8);
  auVar15._11_5_ = auVar16._11_5_;
  auVar15._8_2_ = 0;
  auVar15._0_8_ = auVar13._0_8_;
  auVar15[10] = (char)((uint)uVar1 >> 8);
  auVar14._10_6_ = auVar15._10_6_;
  auVar14[8] = 0;
  auVar14._0_8_ = auVar13._0_8_;
  auVar14[9] = (char)uVar4;
  auVar13._9_7_ = auVar14._9_7_;
  auVar13[8] = (char)uVar1;
  Var7 = CONCAT91(CONCAT81(auVar13._8_8_,(char)((uint)uVar5 >> 0x18)),(char)((uint)uVar25 >> 0x18));
  auVar12._6_10_ = Var7;
  auVar12[5] = (char)((uint)uVar5 >> 0x10);
  auVar12[4] = (char)((uint)uVar25 >> 0x10);
  auVar12._0_4_ = uVar25;
  auVar6._2_12_ = auVar12._4_12_;
  auVar6[1] = (char)((uint)uVar5 >> 8);
  auVar6[0] = (char)((uint)uVar25 >> 8);
  uVar1 = *(undefined4 *)(b + lVar11);
  uVar4 = *(undefined4 *)(b + lVar11 * 5);
  auVar35._8_6_ = 0;
  auVar35._0_8_ = auVar29._0_8_;
  auVar35[0xe] = (char)((uint)uVar2 >> 0x18);
  auVar35[0xf] = (char)((uint)uVar4 >> 0x18);
  auVar34._14_2_ = auVar35._14_2_;
  auVar34._8_5_ = 0;
  auVar34._0_8_ = auVar29._0_8_;
  auVar34[0xd] = (char)((uint)uVar4 >> 0x10);
  auVar33._13_3_ = auVar34._13_3_;
  auVar33._8_4_ = 0;
  auVar33._0_8_ = auVar29._0_8_;
  auVar33[0xc] = (char)((uint)uVar2 >> 0x10);
  auVar32._12_4_ = auVar33._12_4_;
  auVar32._8_3_ = 0;
  auVar32._0_8_ = auVar29._0_8_;
  auVar32[0xb] = (char)((uint)uVar4 >> 8);
  auVar31._11_5_ = auVar32._11_5_;
  auVar31._8_2_ = 0;
  auVar31._0_8_ = auVar29._0_8_;
  auVar31[10] = (char)((uint)uVar2 >> 8);
  auVar30._10_6_ = auVar31._10_6_;
  auVar30[8] = 0;
  auVar30._0_8_ = auVar29._0_8_;
  auVar30[9] = (char)uVar4;
  auVar29._9_7_ = auVar30._9_7_;
  auVar29[8] = (char)uVar2;
  Var9 = CONCAT91(CONCAT81(auVar29._8_8_,(char)((uint)uVar1 >> 0x18)),(char)((uint)uVar3 >> 0x18));
  auVar28._6_10_ = Var9;
  auVar28[5] = (char)((uint)uVar1 >> 0x10);
  auVar28[4] = (char)((uint)uVar3 >> 0x10);
  auVar28._0_4_ = uVar3;
  auVar8._2_12_ = auVar28._4_12_;
  auVar8[1] = (char)((uint)uVar1 >> 8);
  auVar8[0] = (char)((uint)uVar3 >> 8);
  auVar27._0_2_ = CONCAT11((char)uVar1,(char)uVar3);
  auVar27._2_14_ = auVar8;
  auVar24._0_12_ = auVar27._0_12_;
  auVar24._12_2_ = (short)Var9;
  auVar24._14_2_ = (short)Var7;
  auVar23._12_4_ = auVar24._12_4_;
  auVar23._0_10_ = auVar27._0_10_;
  auVar23._10_2_ = auVar12._4_2_;
  auVar22._10_6_ = auVar23._10_6_;
  auVar22._0_8_ = auVar27._0_8_;
  auVar22._8_2_ = auVar28._4_2_;
  auVar10._4_8_ = auVar22._8_8_;
  auVar10._2_2_ = auVar6._0_2_;
  auVar10._0_2_ = auVar8._0_2_;
  auVar21._0_4_ = CONCAT22(CONCAT11((char)uVar5,(char)uVar25),auVar27._0_2_);
  auVar21._4_12_ = auVar10;
  uVar25 = CONCAT22(auVar13._8_2_,auVar29._8_2_);
  auVar26._0_8_ = CONCAT26(auVar15._10_2_,CONCAT24(auVar31._10_2_,uVar25));
  auVar26._8_2_ = auVar33._12_2_;
  auVar26._10_2_ = auVar17._12_2_;
  auVar36._12_2_ = auVar34._14_2_;
  auVar36._0_12_ = auVar26;
  auVar36._14_2_ = auVar18._14_2_;
  auVar20._0_8_ = auVar21._0_8_;
  auVar20._8_4_ = auVar10._0_4_;
  auVar20._12_4_ = (int)((ulong)auVar26._0_8_ >> 0x20);
  (*p)[0] = CONCAT44(uVar25,auVar21._0_4_);
  (*p)[1] = auVar20._8_8_;
  *(int *)*q = auVar22._8_4_;
  *(int *)((long)*q + 4) = auVar26._8_4_;
  *(undefined4 *)(*q + 1) = auVar23._12_4_;
  *(int *)((long)*q + 0xc) = auVar36._12_4_;
  return;
}

Assistant:

static WEBP_INLINE void Load8x4_SSE2(const uint8_t* const b, int stride,
                                     __m128i* const p, __m128i* const q) {
  // A0 = 63 62 61 60 23 22 21 20 43 42 41 40 03 02 01 00
  // A1 = 73 72 71 70 33 32 31 30 53 52 51 50 13 12 11 10
  const __m128i A0 = _mm_set_epi32(
      WebPMemToUint32(&b[6 * stride]), WebPMemToUint32(&b[2 * stride]),
      WebPMemToUint32(&b[4 * stride]), WebPMemToUint32(&b[0 * stride]));
  const __m128i A1 = _mm_set_epi32(
      WebPMemToUint32(&b[7 * stride]), WebPMemToUint32(&b[3 * stride]),
      WebPMemToUint32(&b[5 * stride]), WebPMemToUint32(&b[1 * stride]));

  // B0 = 53 43 52 42 51 41 50 40 13 03 12 02 11 01 10 00
  // B1 = 73 63 72 62 71 61 70 60 33 23 32 22 31 21 30 20
  const __m128i B0 = _mm_unpacklo_epi8(A0, A1);
  const __m128i B1 = _mm_unpackhi_epi8(A0, A1);

  // C0 = 33 23 13 03 32 22 12 02 31 21 11 01 30 20 10 00
  // C1 = 73 63 53 43 72 62 52 42 71 61 51 41 70 60 50 40
  const __m128i C0 = _mm_unpacklo_epi16(B0, B1);
  const __m128i C1 = _mm_unpackhi_epi16(B0, B1);

  // *p = 71 61 51 41 31 21 11 01 70 60 50 40 30 20 10 00
  // *q = 73 63 53 43 33 23 13 03 72 62 52 42 32 22 12 02
  *p = _mm_unpacklo_epi32(C0, C1);
  *q = _mm_unpackhi_epi32(C0, C1);
}